

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::basic_substring<const_char>::first_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  ulong uVar1;
  size_t i;
  size_t sVar2;
  ulong local_30;
  
  uVar1 = this->len;
  if (this->len < start && start != 0xffffffffffffffff) {
    basic_substring<char_const>::first_of();
    uVar1 = local_30;
  }
  if (start < uVar1) {
    do {
      if (chars.len != 0) {
        sVar2 = 0;
        do {
          if (this->str[start] == chars.str[sVar2]) {
            return start;
          }
          sVar2 = sVar2 + 1;
        } while (chars.len != sVar2);
      }
      start = start + 1;
    } while (start != uVar1);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t first_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        for(size_t i = start; i < len; ++i)
        {
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars[j])
                    return i;
            }
        }
        return npos;
    }